

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O1

time_t qMkTime(tm *when)

{
  time_t tVar1;
  
  tVar1 = mktime((tm *)when);
  return tVar1;
}

Assistant:

time_t qMkTime(struct tm *when)
{
    const auto locker = qt_scoped_lock(environmentMutex);
#if defined(Q_OS_WIN)
    // QTBUG-83881 MS's mktime() seems to need _tzset() called first.
    _tzset();
#endif
    return mktime(when);
}